

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_record.c
# Opt level: O2

int playCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,void *userData)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = *userData;
  lVar2 = (long)(iVar1 * 2) * 4 + *(long *)((long)userData + 8);
  iVar4 = *(int *)((long)userData + 4);
  uVar3 = iVar4 - iVar1;
  if (uVar3 < framesPerBuffer) {
    for (lVar5 = 0; uVar3 != (uint)lVar5; lVar5 = lVar5 + 1) {
      *(undefined4 *)outputBuffer = *(undefined4 *)(lVar2 + lVar5 * 8);
      *(undefined4 *)((long)outputBuffer + 4) = *(undefined4 *)(lVar2 + 4 + lVar5 * 8);
      outputBuffer = (void *)((long)outputBuffer + 8);
    }
    iVar1 = 1;
    for (lVar2 = 0; uVar3 + (int)lVar2 < framesPerBuffer; lVar2 = lVar2 + 1) {
      *(undefined8 *)((long)outputBuffer + lVar2 * 2 * 4) = 0;
    }
  }
  else {
    for (lVar5 = 0; (uint)lVar5 < (uint)framesPerBuffer; lVar5 = lVar5 + 1) {
      *(undefined4 *)((long)outputBuffer + lVar5 * 8) = *(undefined4 *)(lVar2 + lVar5 * 8);
      *(undefined4 *)((long)outputBuffer + lVar5 * 8 + 4) = *(undefined4 *)(lVar2 + 4 + lVar5 * 8);
    }
    iVar4 = iVar1 + (uint)framesPerBuffer;
    iVar1 = 0;
  }
  *(int *)userData = iVar4;
  return iVar1;
}

Assistant:

static int playCallback( const void *inputBuffer, void *outputBuffer,
                         unsigned long framesPerBuffer,
                         const PaStreamCallbackTimeInfo* timeInfo,
                         PaStreamCallbackFlags statusFlags,
                         void *userData )
{
    paTestData *data = (paTestData*)userData;
    SAMPLE *rptr = &data->recordedSamples[data->frameIndex * NUM_CHANNELS];
    SAMPLE *wptr = (SAMPLE*)outputBuffer;
    unsigned int i;
    int finished;
    unsigned int framesLeft = data->maxFrameIndex - data->frameIndex;

    (void) inputBuffer; /* Prevent unused variable warnings. */
    (void) timeInfo;
    (void) statusFlags;
    (void) userData;

    if( framesLeft < framesPerBuffer )
    {
        /* final buffer... */
        for( i=0; i<framesLeft; i++ )
        {
            *wptr++ = *rptr++;  /* left */
            if( NUM_CHANNELS == 2 ) *wptr++ = *rptr++;  /* right */
        }
        for( ; i<framesPerBuffer; i++ )
        {
            *wptr++ = 0;  /* left */
            if( NUM_CHANNELS == 2 ) *wptr++ = 0;  /* right */
        }
        data->frameIndex += framesLeft;
        finished = paComplete;
    }
    else
    {
        for( i=0; i<framesPerBuffer; i++ )
        {
            *wptr++ = *rptr++;  /* left */
            if( NUM_CHANNELS == 2 ) *wptr++ = *rptr++;  /* right */
        }
        data->frameIndex += framesPerBuffer;
        finished = paContinue;
    }
    return finished;
}